

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v3.cpp
# Opt level: O2

void __thiscall
LASwriteItemCompressed_POINT14_v3::~LASwriteItemCompressed_POINT14_v3
          (LASwriteItemCompressed_POINT14_v3 *this)

{
  ArithmeticModel *pAVar1;
  IntegerCompressor *pIVar2;
  ArithmeticEncoder *pAVar3;
  long lVar4;
  ArithmeticModel **ppAVar5;
  ArithmeticModel **ppAVar6;
  long lVar7;
  
  (this->super_LASwriteItemCompressed).super_LASwriteItem._vptr_LASwriteItem =
       (_func_int **)&PTR_write_00160360;
  ppAVar5 = this->contexts[0].m_return_number;
  ppAVar6 = this->contexts[0].m_user_data;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    pAVar1 = this->contexts[lVar4].m_changed_values[0];
    if (pAVar1 != (ArithmeticModel *)0x0) {
      ArithmeticEncoder::destroySymbolModel(this->enc_channel_returns_XY,pAVar1);
      ArithmeticEncoder::destroySymbolModel
                (this->enc_channel_returns_XY,this->contexts[lVar4].m_changed_values[1]);
      ArithmeticEncoder::destroySymbolModel
                (this->enc_channel_returns_XY,this->contexts[lVar4].m_changed_values[2]);
      ArithmeticEncoder::destroySymbolModel
                (this->enc_channel_returns_XY,this->contexts[lVar4].m_changed_values[3]);
      ArithmeticEncoder::destroySymbolModel
                (this->enc_channel_returns_XY,this->contexts[lVar4].m_changed_values[4]);
      ArithmeticEncoder::destroySymbolModel
                (this->enc_channel_returns_XY,this->contexts[lVar4].m_changed_values[5]);
      ArithmeticEncoder::destroySymbolModel
                (this->enc_channel_returns_XY,this->contexts[lVar4].m_changed_values[6]);
      ArithmeticEncoder::destroySymbolModel
                (this->enc_channel_returns_XY,this->contexts[lVar4].m_changed_values[7]);
      ArithmeticEncoder::destroySymbolModel
                (this->enc_channel_returns_XY,this->contexts[lVar4].m_scanner_channel);
      for (lVar7 = -0x80; lVar7 != 0; lVar7 = lVar7 + 8) {
        pAVar1 = *(ArithmeticModel **)((long)ppAVar5 + lVar7 + -8);
        if (pAVar1 != (ArithmeticModel *)0x0) {
          ArithmeticEncoder::destroySymbolModel(this->enc_channel_returns_XY,pAVar1);
        }
        pAVar1 = *(ArithmeticModel **)((long)ppAVar5 + lVar7 + 0x80);
        if (pAVar1 != (ArithmeticModel *)0x0) {
          ArithmeticEncoder::destroySymbolModel(this->enc_channel_returns_XY,pAVar1);
        }
      }
      ArithmeticEncoder::destroySymbolModel
                (this->enc_channel_returns_XY,this->contexts[lVar4].m_return_number_gps_same);
      pIVar2 = this->contexts[lVar4].ic_dX;
      if (pIVar2 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar2);
      }
      operator_delete(pIVar2);
      pIVar2 = this->contexts[lVar4].ic_dY;
      if (pIVar2 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar2);
      }
      operator_delete(pIVar2);
      pIVar2 = this->contexts[lVar4].ic_Z;
      if (pIVar2 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar2);
      }
      operator_delete(pIVar2);
      for (lVar7 = -0x200; lVar7 != 0; lVar7 = lVar7 + 8) {
        pAVar1 = *(ArithmeticModel **)((long)ppAVar6 + lVar7 + -0x200);
        if (pAVar1 != (ArithmeticModel *)0x0) {
          ArithmeticEncoder::destroySymbolModel(this->enc_classification,pAVar1);
        }
        if (*(ArithmeticModel **)((long)ppAVar6 + lVar7) != (ArithmeticModel *)0x0) {
          ArithmeticEncoder::destroySymbolModel
                    (this->enc_flags,*(ArithmeticModel **)((long)ppAVar6 + lVar7));
        }
        pAVar1 = *(ArithmeticModel **)((long)ppAVar6 + lVar7 + 0x200);
        if (pAVar1 != (ArithmeticModel *)0x0) {
          ArithmeticEncoder::destroySymbolModel(this->enc_user_data,pAVar1);
        }
      }
      pIVar2 = this->contexts[lVar4].ic_intensity;
      if (pIVar2 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar2);
      }
      operator_delete(pIVar2);
      pIVar2 = this->contexts[lVar4].ic_scan_angle;
      if (pIVar2 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar2);
      }
      operator_delete(pIVar2);
      pIVar2 = this->contexts[lVar4].ic_point_source_ID;
      if (pIVar2 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar2);
      }
      operator_delete(pIVar2);
      ArithmeticEncoder::destroySymbolModel
                (this->enc_gps_time,this->contexts[lVar4].m_gpstime_multi);
      ArithmeticEncoder::destroySymbolModel
                (this->enc_gps_time,this->contexts[lVar4].m_gpstime_0diff);
      pIVar2 = this->contexts[lVar4].ic_gpstime;
      if (pIVar2 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar2);
      }
      operator_delete(pIVar2);
    }
    ppAVar5 = ppAVar5 + 0x15b;
    ppAVar6 = ppAVar6 + 0x15b;
  }
  if (this->outstream_channel_returns_XY != (ByteStreamOutArray *)0x0) {
    pAVar3 = this->enc_channel_returns_XY;
    if (pAVar3 != (ArithmeticEncoder *)0x0) {
      ArithmeticEncoder::~ArithmeticEncoder(pAVar3);
    }
    operator_delete(pAVar3);
    pAVar3 = this->enc_Z;
    if (pAVar3 != (ArithmeticEncoder *)0x0) {
      ArithmeticEncoder::~ArithmeticEncoder(pAVar3);
    }
    operator_delete(pAVar3);
    pAVar3 = this->enc_classification;
    if (pAVar3 != (ArithmeticEncoder *)0x0) {
      ArithmeticEncoder::~ArithmeticEncoder(pAVar3);
    }
    operator_delete(pAVar3);
    pAVar3 = this->enc_flags;
    if (pAVar3 != (ArithmeticEncoder *)0x0) {
      ArithmeticEncoder::~ArithmeticEncoder(pAVar3);
    }
    operator_delete(pAVar3);
    pAVar3 = this->enc_intensity;
    if (pAVar3 != (ArithmeticEncoder *)0x0) {
      ArithmeticEncoder::~ArithmeticEncoder(pAVar3);
    }
    operator_delete(pAVar3);
    pAVar3 = this->enc_scan_angle;
    if (pAVar3 != (ArithmeticEncoder *)0x0) {
      ArithmeticEncoder::~ArithmeticEncoder(pAVar3);
    }
    operator_delete(pAVar3);
    pAVar3 = this->enc_user_data;
    if (pAVar3 != (ArithmeticEncoder *)0x0) {
      ArithmeticEncoder::~ArithmeticEncoder(pAVar3);
    }
    operator_delete(pAVar3);
    pAVar3 = this->enc_point_source;
    if (pAVar3 != (ArithmeticEncoder *)0x0) {
      ArithmeticEncoder::~ArithmeticEncoder(pAVar3);
    }
    operator_delete(pAVar3);
    pAVar3 = this->enc_gps_time;
    if (pAVar3 != (ArithmeticEncoder *)0x0) {
      ArithmeticEncoder::~ArithmeticEncoder(pAVar3);
    }
    operator_delete(pAVar3);
    if (this->outstream_channel_returns_XY != (ByteStreamOutArray *)0x0) {
      (*(this->outstream_channel_returns_XY->super_ByteStreamOut)._vptr_ByteStreamOut[0xd])();
    }
    if (this->outstream_Z != (ByteStreamOutArray *)0x0) {
      (*(this->outstream_Z->super_ByteStreamOut)._vptr_ByteStreamOut[0xd])();
    }
    if (this->outstream_classification != (ByteStreamOutArray *)0x0) {
      (*(this->outstream_classification->super_ByteStreamOut)._vptr_ByteStreamOut[0xd])();
    }
    if (this->outstream_flags != (ByteStreamOutArray *)0x0) {
      (*(this->outstream_flags->super_ByteStreamOut)._vptr_ByteStreamOut[0xd])();
    }
    if (this->outstream_intensity != (ByteStreamOutArray *)0x0) {
      (*(this->outstream_intensity->super_ByteStreamOut)._vptr_ByteStreamOut[0xd])();
    }
    if (this->outstream_scan_angle != (ByteStreamOutArray *)0x0) {
      (*(this->outstream_scan_angle->super_ByteStreamOut)._vptr_ByteStreamOut[0xd])();
    }
    if (this->outstream_user_data != (ByteStreamOutArray *)0x0) {
      (*(this->outstream_user_data->super_ByteStreamOut)._vptr_ByteStreamOut[0xd])();
    }
    if (this->outstream_point_source != (ByteStreamOutArray *)0x0) {
      (*(this->outstream_point_source->super_ByteStreamOut)._vptr_ByteStreamOut[0xd])();
    }
    if (this->outstream_gps_time != (ByteStreamOutArray *)0x0) {
      (*(this->outstream_gps_time->super_ByteStreamOut)._vptr_ByteStreamOut[0xd])();
      return;
    }
  }
  return;
}

Assistant:

LASwriteItemCompressed_POINT14_v3::~LASwriteItemCompressed_POINT14_v3()
{
  U32 c, i;

  /* destroy all initialized scanner channel contexts */

  for (c = 0; c < 4; c++)
  {
    if (contexts[c].m_changed_values[0])
    {
      enc_channel_returns_XY->destroySymbolModel(contexts[c].m_changed_values[0]);
      enc_channel_returns_XY->destroySymbolModel(contexts[c].m_changed_values[1]);
      enc_channel_returns_XY->destroySymbolModel(contexts[c].m_changed_values[2]);
      enc_channel_returns_XY->destroySymbolModel(contexts[c].m_changed_values[3]);
      enc_channel_returns_XY->destroySymbolModel(contexts[c].m_changed_values[4]);
      enc_channel_returns_XY->destroySymbolModel(contexts[c].m_changed_values[5]);
      enc_channel_returns_XY->destroySymbolModel(contexts[c].m_changed_values[6]);
      enc_channel_returns_XY->destroySymbolModel(contexts[c].m_changed_values[7]);
      enc_channel_returns_XY->destroySymbolModel(contexts[c].m_scanner_channel);
      for (i = 0; i < 16; i++)
      {
        if (contexts[c].m_number_of_returns[i]) enc_channel_returns_XY->destroySymbolModel(contexts[c].m_number_of_returns[i]);
        if (contexts[c].m_return_number[i]) enc_channel_returns_XY->destroySymbolModel(contexts[c].m_return_number[i]);
      }
      enc_channel_returns_XY->destroySymbolModel(contexts[c].m_return_number_gps_same);
      delete contexts[c].ic_dX;
      delete contexts[c].ic_dY;
      delete contexts[c].ic_Z;
      for (i = 0; i < 64; i++)
      {
        if (contexts[c].m_classification[i]) enc_classification->destroySymbolModel(contexts[c].m_classification[i]);
        if (contexts[c].m_flags[i]) enc_flags->destroySymbolModel(contexts[c].m_flags[i]);
        if (contexts[c].m_user_data[i]) enc_user_data->destroySymbolModel(contexts[c].m_user_data[i]);
      }
      delete contexts[c].ic_intensity;
      delete contexts[c].ic_scan_angle;
      delete contexts[c].ic_point_source_ID;
      enc_gps_time->destroySymbolModel(contexts[c].m_gpstime_multi);
      enc_gps_time->destroySymbolModel(contexts[c].m_gpstime_0diff);
      delete contexts[c].ic_gpstime;
    }
  }

  /* destroy all encoders and outstreams  */

  if (outstream_channel_returns_XY)
  {
    delete enc_channel_returns_XY;
    delete enc_Z;
    delete enc_classification;
    delete enc_flags;
    delete enc_intensity;
    delete enc_scan_angle;
    delete enc_user_data;
    delete enc_point_source;
    delete enc_gps_time;

    delete outstream_channel_returns_XY;
    delete outstream_Z;
    delete outstream_classification;
    delete outstream_flags;
    delete outstream_intensity;
    delete outstream_scan_angle;
    delete outstream_user_data;
    delete outstream_point_source;
    delete outstream_gps_time;
  }

//  LASMessage(LAS_VERBOSE, "%u %u %u %u %u %u %u %u %u", num_bytes_channel_returns_XY, num_bytes_Z, num_bytes_classification, num_bytes_flags, num_bytes_intensity, num_bytes_scan_angle, num_bytes_user_data, num_bytes_point_source, num_bytes_gps_time);
}